

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

void __thiscall senjo::UCIAdapter::UCINewGameCommand(UCIAdapter *this,char *params)

{
  size_t sVar1;
  int iVar2;
  Output local_20;
  
  sVar1 = DAT_001b6788;
  if (params != (char *)0x0 && DAT_001b6788 != 0) {
    iVar2 = strncmp(params,token::Help_abi_cxx11_,DAT_001b6788);
    if (iVar2 == 0) {
      if (params[sVar1] != '\0') {
        iVar2 = isspace((int)params[sVar1]);
        if (iVar2 == 0) goto LAB_00134e82;
      }
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,token::UciNewGame_abi_cxx11_,DAT_001b69a8);
      Output::~Output(&local_20);
      Output::Output(&local_20,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Clear all search data.",0x16);
      Output::~Output(&local_20);
      return;
    }
  }
LAB_00134e82:
  iVar2 = (*this->engine->_vptr_ChessEngine[8])();
  if ((char)iVar2 == '\0') {
    (*this->engine->_vptr_ChessEngine[7])();
  }
  (this->lastPosition)._M_string_length = 0;
  *(this->lastPosition)._M_dataplus._M_p = '\0';
  (*this->engine->_vptr_ChessEngine[0xe])();
  return;
}

Assistant:

void UCIAdapter::UCINewGameCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::UciNewGame;
    Output() << "Clear all search data.";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  lastPosition.clear();
  engine->ClearSearchData();
}